

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_StdioFile.cc
# Opt level: O3

void __thiscall Pl_StdioFile::finish(Pl_StdioFile *this)

{
  int iVar1;
  int *piVar2;
  logic_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  iVar1 = fflush((FILE *)((this->m)._M_t.
                          super___uniq_ptr_impl<Pl_StdioFile::Members,_std::default_delete<Pl_StdioFile::Members>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_Pl_StdioFile::Members_*,_std::default_delete<Pl_StdioFile::Members>_>
                          .super__Head_base<0UL,_Pl_StdioFile::Members_*,_false>._M_head_impl)->file
                );
  if (iVar1 == -1) {
    piVar2 = __errno_location();
    if (*piVar2 == 9) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::operator+(&bStack_38,&(this->super_Pipeline).identifier,
                     ": Pl_StdioFile::finish: stream already closed");
      std::logic_error::logic_error(this_00,(string *)&bStack_38);
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
  }
  return;
}

Assistant:

void
Pl_StdioFile::finish()
{
    if ((fflush(m->file) == -1) && (errno == EBADF)) {
        throw std::logic_error(this->identifier + ": Pl_StdioFile::finish: stream already closed");
    }
}